

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

uint * Kit_DsdTruthComputeOne(Kit_DsdMan_t *p,Kit_DsdNtk_t *pNtk,uint uSupp)

{
  ushort uVar1;
  int iVar2;
  uint *puVar3;
  uint *pIn;
  uint i;
  
  if (uSupp != 0) {
    Kit_DsdGetSupports(pNtk);
  }
  uVar1 = pNtk->nVars;
  if ((int)(uint)uVar1 <= p->nVars) {
    for (i = 0; i < uVar1; i = i + 1) {
      puVar3 = (uint *)Vec_PtrEntry(p->vTtNodes,i);
      pIn = (uint *)Vec_PtrEntry(p->vTtElems,i);
      Kit_TruthCopy(puVar3,pIn,p->nVars);
      uVar1 = pNtk->nVars;
    }
    iVar2 = Abc_Lit2Var((uint)pNtk->Root);
    puVar3 = Kit_DsdTruthComputeNodeOne_rec(p,pNtk,iVar2,uSupp);
    iVar2 = Abc_LitIsCompl((uint)pNtk->Root);
    if (iVar2 != 0) {
      Kit_TruthNot(puVar3,puVar3,(uint)pNtk->nVars);
    }
    return puVar3;
  }
  __assert_fail("pNtk->nVars <= p->nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitDsd.c"
                ,0x340,
                "unsigned int *Kit_DsdTruthComputeOne(Kit_DsdMan_t *, Kit_DsdNtk_t *, unsigned int)"
               );
}

Assistant:

unsigned * Kit_DsdTruthComputeOne( Kit_DsdMan_t * p, Kit_DsdNtk_t * pNtk, unsigned uSupp )
{
    unsigned * pTruthRes;
    int i;
    // if support is specified, request that supports are available
    if ( uSupp )
        Kit_DsdGetSupports( pNtk );
    // assign elementary truth tables
    assert( pNtk->nVars <= p->nVars );
    for ( i = 0; i < (int)pNtk->nVars; i++ )
        Kit_TruthCopy( (unsigned *)Vec_PtrEntry(p->vTtNodes, i), (unsigned *)Vec_PtrEntry(p->vTtElems, i), p->nVars );
    // compute truth table for each node
    pTruthRes = Kit_DsdTruthComputeNodeOne_rec( p, pNtk, Abc_Lit2Var(pNtk->Root), uSupp );
    // complement the truth table if needed
    if ( Abc_LitIsCompl(pNtk->Root) )
        Kit_TruthNot( pTruthRes, pTruthRes, pNtk->nVars );
    return pTruthRes;
}